

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O1

int zt_ptr_array_del(zt_ptr_array *array,void *data)

{
  void **ppvVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if ((data != (void *)0x0 && array != (zt_ptr_array *)0x0) &&
     (uVar3 = (ulong)(uint)array->count, 0 < array->count)) {
    lVar4 = 0;
    do {
      ppvVar1 = array->array;
      if (ppvVar1[lVar4] == data) {
        iVar2 = (int)uVar3 + -1;
        if (lVar4 <= (int)uVar3) {
          ppvVar1[lVar4] = ppvVar1[iVar2];
        }
        array->count = iVar2;
        if (array->free_cb != (zt_ptr_array_free_cb)0x0) {
          (*array->free_cb)(data);
        }
      }
      lVar4 = lVar4 + 1;
      uVar3 = (ulong)array->count;
    } while (lVar4 < (long)uVar3);
  }
  return -1;
}

Assistant:

int
zt_ptr_array_del(zt_ptr_array * array, void * data) {
    int32_t i;

    if (array == NULL || data == NULL) {
        return -1;
    }

    for (i = 0; i < array->count; i++) {
        if (array->array[i] == data) {
            zt_ptr_array_move_idx_to_idx(array, array->count - 1, i);
            array->count--;

            if (array->free_cb) {
                array->free_cb(data);
            }
        }
    }

    return -1;
}